

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O2

string * google::protobuf::compiler::objectivec::UnCamelCaseFieldName
                   (string *__return_storage_ptr__,string *name,FieldDescriptor *field)

{
  bool bVar1;
  Type TVar2;
  int i;
  ulong uVar3;
  allocator<char> local_81;
  string worker;
  string local_60;
  string local_40;
  
  std::__cxx11::string::string((string *)&worker,(string *)name);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"_p",(allocator<char> *)&local_40);
  bVar1 = HasSuffixString(&worker,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"_p",&local_81);
    StripSuffixString(&local_60,&worker,&local_40);
    std::__cxx11::string::operator=((string *)&worker,(string *)&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_40);
  }
  if (*(int *)(field + 0x4c) == 3) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_60,"Array",(allocator<char> *)&local_40);
    bVar1 = HasSuffixString(&worker,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    if (bVar1) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"Array",&local_81);
      StripSuffixString(&local_60,&worker,&local_40);
      std::__cxx11::string::operator=((string *)&worker,(string *)&local_60);
      std::__cxx11::string::~string((string *)&local_60);
      std::__cxx11::string::~string((string *)&local_40);
    }
  }
  TVar2 = FieldDescriptor::type(field);
  if (TVar2 == TYPE_GROUP) {
    if ((worker._M_string_length != 0) && ((byte)(*worker._M_dataplus._M_p + 0x9fU) < 0x1a)) {
      *worker._M_dataplus._M_p = *worker._M_dataplus._M_p + -0x20;
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)worker._M_dataplus._M_p == &worker.field_2) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(worker.field_2._M_allocated_capacity._1_7_,worker.field_2._M_local_buf[0]);
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = worker.field_2._8_8_;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = worker._M_dataplus._M_p;
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(worker.field_2._M_allocated_capacity._1_7_,worker.field_2._M_local_buf[0]);
    }
    __return_storage_ptr__->_M_string_length = worker._M_string_length;
    worker._M_string_length = 0;
    worker.field_2._M_local_buf[0] = '\0';
    worker._M_dataplus._M_p = (pointer)&worker.field_2;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    for (uVar3 = 0; uVar3 < worker._M_string_length; uVar3 = uVar3 + 1) {
      if (((byte)(worker._M_dataplus._M_p[uVar3] + 0xbfU) < 0x1a) && (uVar3 != 0)) {
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
    }
  }
  std::__cxx11::string::~string((string *)&worker);
  return __return_storage_ptr__;
}

Assistant:

string UnCamelCaseFieldName(const string& name, const FieldDescriptor* field) {
  string worker(name);
  if (HasSuffixString(worker, "_p")) {
    worker = StripSuffixString(worker, "_p");
  }
  if (field->is_repeated() && HasSuffixString(worker, "Array")) {
    worker = StripSuffixString(worker, "Array");
  }
  if (field->type() == FieldDescriptor::TYPE_GROUP) {
    if (worker.length() > 0) {
      if (ascii_islower(worker[0])) {
        worker[0] = ascii_toupper(worker[0]);
      }
    }
    return worker;
  } else {
    string result;
    for (int i = 0; i < worker.size(); i++) {
      char c = worker[i];
      if (ascii_isupper(c)) {
        if (i > 0) {
          result += '_';
        }
        result += ascii_tolower(c);
      } else {
        result += c;
      }
    }
    return result;
  }
}